

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_to_end_psnr_test.cc
# Opt level: O2

void __thiscall (anonymous_namespace)::EndToEndTest::~EndToEndTest(EndToEndTest *this)

{
  anon_unknown.dwarf_1072435::EndToEndTest::~EndToEndTest((EndToEndTest *)(this + -0x18));
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    if (encoding_mode_ == ::libaom_test::kOnePassGood ||
        encoding_mode_ == ::libaom_test::kTwoPassGood) {
      cfg_.g_lag_in_frames = 5;
    } else if (encoding_mode_ == ::libaom_test::kRealTime) {
      cfg_.rc_buf_sz = 1000;
      cfg_.rc_buf_initial_sz = 500;
      cfg_.rc_buf_optimal_sz = 600;
    }
  }